

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O1

Vec_Int_t * Vec_IntStartRange(int First,int Range)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  int iVar3;
  ulong uVar4;
  
  pVVar1 = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < Range - 1U) {
    iVar3 = Range;
  }
  pVVar1->nSize = 0;
  pVVar1->nCap = iVar3;
  if (iVar3 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar3 << 2);
  }
  pVVar1->pArray = piVar2;
  pVVar1->nSize = Range;
  if (0 < Range) {
    uVar4 = 0;
    do {
      piVar2[uVar4] = First + (int)uVar4;
      uVar4 = uVar4 + 1;
    } while ((uint)Range != uVar4);
  }
  return pVVar1;
}

Assistant:

static inline Vec_Int_t * Vec_IntStartRange( int First, int Range )
{
    Vec_Int_t * p;
    int i;
    p = Vec_IntAlloc( Range );
    p->nSize = Range;
    for ( i = 0; i < Range; i++ )
        p->pArray[i] = First + i;
    return p;
}